

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip.cpp
# Opt level: O3

bool __thiscall LASzip::unpack(LASzip *this,U8 *bytes,I32 num)

{
  uint uVar1;
  bool bVar2;
  ushort uVar3;
  LASitem *pLVar4;
  unsigned_short *puVar5;
  long lVar6;
  char *error;
  ulong uVar7;
  
  if (num < 0x22) {
    error = "too few bytes to unpack";
  }
  else {
    uVar1 = num - 0x22;
    if ((uVar1 * -0x55555555 >> 1 | (uint)((uVar1 * -0x55555555 & 1) != 0) << 0x1f) < 0x2aaaaaab) {
      if (5 < uVar1) {
        uVar3 = (ushort)((ulong)uVar1 / 6);
        this->num_items = uVar3;
        if (this->items != (LASitem *)0x0) {
          operator_delete__(this->items);
          uVar3 = this->num_items;
        }
        pLVar4 = (LASitem *)operator_new__((ulong)uVar3 << 3);
        this->items = pLVar4;
        this->compressor = *(unsigned_short *)bytes;
        this->coder = *(unsigned_short *)(bytes + 2);
        this->version_major = bytes[4];
        this->version_minor = bytes[5];
        this->version_revision = *(unsigned_short *)(bytes + 6);
        this->options = *(uint *)(bytes + 8);
        this->chunk_size = *(uint *)(bytes + 0xc);
        this->number_of_special_evlrs = *(SIGNED_INT64 *)(bytes + 0x10);
        this->offset_to_special_evlrs = *(SIGNED_INT64 *)(bytes + 0x18);
        uVar3 = *(ushort *)(bytes + 0x20);
        this->num_items = uVar3;
        if (uVar3 == 0) {
          if (num == 0x22) {
            return true;
          }
        }
        else {
          puVar5 = &pLVar4->size;
          lVar6 = 0;
          do {
            ((LASitem *)(puVar5 + -2))->type = (uint)*(ushort *)(bytes + lVar6 + 0x22);
            *(undefined4 *)puVar5 = *(undefined4 *)(bytes + lVar6 + 0x24);
            puVar5 = puVar5 + 4;
            lVar6 = lVar6 + 6;
          } while ((ulong)((uint)uVar3 + (uint)uVar3) * 3 != lVar6);
          if ((ulong)(uint)num - 0x22 == lVar6) {
            if (uVar3 == 0) {
              return true;
            }
            lVar6 = 0;
            uVar7 = 0;
            do {
              bVar2 = check_item(this,(LASitem *)((long)&this->items->type + lVar6));
              if (!bVar2) {
                return bVar2;
              }
              uVar7 = uVar7 + 1;
              lVar6 = lVar6 + 8;
            } while (uVar7 < this->num_items);
            return bVar2;
          }
        }
        __assert_fail("(bytes + num) == b",
                      "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/laszip.cpp"
                      ,0x7f,"bool LASzip::unpack(const U8 *, const I32)");
      }
      error = "zero items to unpack";
    }
    else {
      error = "wrong number bytes to unpack";
    }
  }
  return_error(this,error);
  return false;
}

Assistant:

bool LASzip::unpack(const U8* bytes, const I32 num)
{
  // check input
  if (num < 34) return return_error("too few bytes to unpack");
  if (((num - 34) % 6) != 0) return return_error("wrong number bytes to unpack"); 
  if (((num - 34) / 6) == 0) return return_error("zero items to unpack");
  num_items = (num - 34) / 6;

  // create item list
  if (items) delete [] items;
  items = new LASitem[num_items];

  // do the unpacking
  U16 i;
  const U8* b = bytes;
  compressor = *((const U16*)b);
  b += 2;
  coder = *((const U16*)b);
  b += 2;
  version_major = *((const U8*)b);
  b += 1;
  version_minor = *((const U8*)b);
  b += 1;
  version_revision = *((const U16*)b);
  b += 2;
  options = *((const U32*)b);
  b += 4;
  chunk_size = *((const U32*)b);
  b += 4;
  number_of_special_evlrs = *((const I64*)b);
  b += 8;
  offset_to_special_evlrs = *((const I64*)b);
  b += 8;
  num_items = *((const U16*)b);
  b += 2;
  for (i = 0; i < num_items; i++)
  {
    items[i].type = (LASitem::Type)*((const U16*)b);
    b += 2;
    items[i].size = *((const U16*)b);
    b += 2;
    items[i].version = *((const U16*)b);
    b += 2;
  }
  assert((bytes + num) == b);

  // check if we support the contents

  for (i = 0; i < num_items; i++)
  {
    if (!check_item(&items[i])) return false;
  }
  return true;
}